

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.hh
# Opt level: O3

GameResult * __thiscall Game::play(Game *this)

{
  State *s;
  char cVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  int extraout_var;
  pointer pGVar5;
  int extraout_var_00;
  size_t sVar6;
  int iVar7;
  pointer pGVar8;
  pointer ppAVar9;
  bool *pbVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  long lVar18;
  float fVar19;
  undefined4 uVar20;
  undefined4 uVar22;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  int iVar26;
  undefined1 auVar24 [16];
  int iVar27;
  undefined1 auVar25 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar49;
  int iVar53;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM6 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar54 [16];
  vector<int,_std::allocator<int>_> ghosts_pos;
  vector<Position,_std::allocator<Position>_> ghost_previous_pos;
  char str [200];
  undefined1 local_158 [16];
  int *local_148;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_138;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_130;
  long local_128;
  int *local_120;
  Position local_118;
  vector<Position,_std::allocator<Position>_> local_110;
  int local_f8 [2];
  undefined1 uStack_f0;
  undefined4 uStack_ef;
  undefined2 uStack_eb;
  undefined1 uStack_e9;
  undefined1 uStack_e8;
  undefined4 uStack_e7;
  undefined2 uStack_e3;
  undefined1 uStack_e1;
  undefined1 uStack_e0;
  undefined4 uStack_df;
  undefined2 uStack_db;
  undefined1 uStack_d9;
  undefined2 local_d8;
  
  if (this->loaded_maze == false) {
    uStack_e8 = 0x6f;
    uStack_e7 = 0x61207475;
    uStack_e3 = 0x6c20;
    uStack_e1 = 0x6f;
    uStack_e0 = 0x61;
    uStack_df = 0x20646564;
    uStack_db = 0x616d;
    uStack_d9 = 0x7a;
    local_f8 = (int  [2])0x70206f7420797254;
    uStack_f0 = 0x6c;
    uStack_ef = 0x77207961;
    uStack_eb = 0x7469;
    uStack_e9 = 0x68;
    local_d8 = 0x65;
    poVar4 = std::operator<<((ostream *)&std::cout,"Error[");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                            );
    poVar4 = std::operator<<(poVar4,"][");
    poVar4 = std::operator<<(poVar4,"play");
    poVar4 = std::operator<<(poVar4,"][Line ");
    iVar3 = 0xab;
  }
  else {
    if (this->pacman != (Agent *)0x0) {
      if (Arguments::plays == 1) {
        poVar4 = operator<<((ostream *)&std::cout,&this->state);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      s = &this->state;
      local_138 = &(this->state).pills._M_h;
      local_130 = &(this->state).powerpills._M_h;
      do {
        iVar3 = (this->state).n_normal_pills_left;
        piVar14 = &(this->state).n_powerpills_left;
        iVar7 = iVar3 + *piVar14;
        if (iVar7 == 0 || SCARRY4(iVar3,*piVar14) != iVar7 < 0) break;
        if (Arguments::plays == 1) {
          std::ostream::flush();
          usleep((__useconds_t)(long)Arguments::visualization_speed);
        }
        update_ghost_states(this);
        piVar14 = &(this->state).round;
        *piVar14 = *piVar14 + 1;
        iVar3 = (this->state).n_rounds_powerpill;
        if (iVar3 < 2) {
          iVar3 = 1;
        }
        (this->state).n_rounds_powerpill = iVar3 + -1;
        iVar3 = (**this->pacman->_vptr_Agent)(this->pacman,s,0);
        local_118 = (this->state).pacman.pos;
        std::vector<Position,_std::allocator<Position>_>::vector
                  (&local_110,(long)State::n_ghosts,(allocator_type *)local_f8);
        if (0 < State::n_ghosts) {
          pGVar5 = (this->state).ghosts.
                   super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar12 = (long)State::n_ghosts;
          lVar15 = 0;
          do {
            local_110.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15] = (pGVar5->super_Agent_State).pos;
            lVar15 = lVar15 + 1;
            pGVar5 = pGVar5 + 1;
          } while (lVar15 < lVar12);
        }
        if (((this->state).pacman.dir.i == iVar3) && ((this->state).pacman.dir.j == extraout_var)) {
          fVar19 = Arguments::pacman_speed + (this->state).pacman.step;
          (this->state).pacman.step = fVar19;
          if (fVar19 < 1.0) goto LAB_0010b38b;
          (this->state).pacman.step = fVar19 + -1.0;
          lVar15 = (long)iVar3 + (long)(this->state).pacman.pos.i;
          lVar18 = (long)extraout_var + (long)(this->state).pacman.pos.j;
          lVar12 = lVar15 * 3;
          cVar1 = *(char *)(*(long *)&(this->state).maze.t.
                                      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar15].
                                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data + lVar18);
          if (cVar1 == '%') {
            uStack_e8 = 0x69;
            uStack_e7 = 0x77206874;
            uStack_e3 = 0x6c61;
            uStack_e1 = 0x6c;
            uStack_e0 = 0;
            local_f8 = (int  [2])0x63206e616d636150;
            uStack_f0 = 0x72;
            uStack_ef = 0x65687361;
            uStack_eb = 0x2073;
            uStack_e9 = 0x77;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Debug[",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                       ,0x5a);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][",2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"play",4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][Line ",7);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xcf);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
            sVar6 = strlen((char *)local_f8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_f8,sVar6);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            goto LAB_0010b38b;
          }
          local_128 = lVar12;
          if (cVar1 == 'X') {
            uStack_e8 = 0x69;
            uStack_e7 = 0x73206874;
            uStack_e3 = 0x6170;
            uStack_e1 = 0x77;
            uStack_e0 = 0x6e;
            uStack_df = 0x65726120;
            uStack_db = 0x61;
            local_f8 = (int  [2])0x63206e616d636150;
            uStack_f0 = 0x72;
            uStack_ef = 0x65687361;
            uStack_eb = 0x2073;
            uStack_e9 = 0x77;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Debug[",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                       ,0x5a);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][",2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"play",4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][Line ",7);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xd2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
            sVar6 = strlen((char *)local_f8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_f8,sVar6);
            std::endl<char,std::char_traits<char>>(poVar4);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                          ,0xd3,"GameResult &Game::play()");
          }
          (this->state).pacman.pos.i = (int)lVar15;
          (this->state).pacman.pos.j = (int)lVar18;
          local_158 = ZEXT816(0);
          local_148 = (int *)0x0;
          pGVar5 = (this->state).ghosts.
                   super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pGVar8 = (this->state).ghosts.
                   super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pGVar8 != pGVar5) {
            uVar17 = 0;
            do {
              iVar3 = (int)uVar17;
              if ((pGVar5[uVar17].super_Agent_State.pos.i == (int)lVar15) &&
                 (pGVar5[uVar17].super_Agent_State.pos.j == (int)lVar18)) {
                local_f8[0] = iVar3;
                if ((int *)local_158._8_8_ == local_148) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)local_158,
                             (iterator)local_158._8_8_,local_f8);
                  pGVar5 = (this->state).ghosts.
                           super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pGVar8 = (this->state).ghosts.
                           super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                }
                else {
                  *(int *)local_158._8_8_ = iVar3;
                  local_158._8_8_ = (int *)(local_158._8_8_ + 4);
                }
              }
              uVar17 = (ulong)(iVar3 + 1);
              uVar13 = ((long)pGVar8 - (long)pGVar5 >> 2) * -0xf0f0f0f0f0f0f0f;
            } while (uVar17 <= uVar13 && uVar13 - uVar17 != 0);
            local_120 = (int *)local_158._8_8_;
            piVar14 = (int *)local_158._0_8_;
            if (local_158._0_8_ != local_158._8_8_) {
              do {
                if ((this->state).n_rounds_powerpill < 1) {
LAB_0010bdad:
                  this->game_over = true;
LAB_0010bdb4:
                  iVar3 = 9;
                  bVar2 = false;
                  goto LAB_0010bdc8;
                }
                iVar3 = *piVar14;
                pGVar5 = (this->state).ghosts.
                         super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((pGVar5[iVar3].maybe_scared & 1U) == 0) goto LAB_0010bdad;
                (*this->pacman->_vptr_Agent[4])();
                pGVar5 = pGVar5 + iVar3;
                pGVar5->maybe_scared = false;
                pGVar5->n_rounds_revive = Arguments::n_rounds_ghost_revive;
                (pGVar5->super_Agent_State).pos.i = -1;
                (pGVar5->super_Agent_State).pos.j = -1;
                if ((this->game_over & 1U) != 0) goto LAB_0010bdb4;
                piVar14 = piVar14 + 1;
              } while (piVar14 != local_120);
            }
          }
          iVar3 = 0;
          bVar2 = true;
          if (cVar1 != ' ') {
            if (cVar1 == 'o') {
              *(undefined1 *)
               (*(long *)&(this->state).maze.t.
                          super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar15].
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data + lVar18) = 0x20;
              piVar14 = &(this->state).n_powerpills_left;
              *piVar14 = *piVar14 + -1;
              local_f8[0] = PathMagic::index_from_pos.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar15].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar18];
              std::
              _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_erase(local_138,local_f8);
              local_f8[0] = (&((PathMagic::index_from_pos.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start)[local_128][lVar18];
              std::
              _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_erase(local_130,local_f8);
              (*this->pacman->_vptr_Agent[3])();
              pGVar5 = (this->state).ghosts.
                       super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pGVar8 = (this->state).ghosts.
                       super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (pGVar5 != pGVar8) {
                uVar17 = (long)pGVar8 + (-0x44 - (long)pGVar5);
                auVar24._8_8_ = 0;
                auVar24._0_8_ = uVar17;
                uVar20 = SUB164(auVar24 * ZEXT816(0xf0f0f0f0f0f0f0f1),8);
                uVar22 = (undefined4)(uVar17 / 0x110000000);
                auVar28._0_8_ = CONCAT44(uVar22,uVar20);
                auVar28._8_4_ = uVar20;
                auVar28._12_4_ = uVar22;
                auVar21._0_8_ = auVar28._0_8_ >> 6;
                auVar21._8_8_ = auVar28._8_8_ >> 6;
                pbVar10 = &pGVar5[0xf].maybe_scared;
                uVar13 = 0;
                do {
                  auVar40._8_4_ = (int)uVar13;
                  auVar40._0_8_ = uVar13;
                  auVar40._12_4_ = (int)(uVar13 >> 0x20);
                  auVar24 = auVar21 ^ _DAT_00119050;
                  auVar28 = (auVar40 | _DAT_00119040) ^ _DAT_00119050;
                  iVar7 = auVar24._0_4_;
                  iVar49 = -(uint)(iVar7 < auVar28._0_4_);
                  iVar11 = auVar24._4_4_;
                  auVar29._4_4_ = -(uint)(iVar11 < auVar28._4_4_);
                  iVar26 = auVar24._8_4_;
                  iVar53 = -(uint)(iVar26 < auVar28._8_4_);
                  iVar27 = auVar24._12_4_;
                  auVar29._12_4_ = -(uint)(iVar27 < auVar28._12_4_);
                  auVar42._4_4_ = iVar49;
                  auVar42._0_4_ = iVar49;
                  auVar42._8_4_ = iVar53;
                  auVar42._12_4_ = iVar53;
                  auVar24 = pshuflw(in_XMM6,auVar42,0xe8);
                  auVar31._4_4_ = -(uint)(auVar28._4_4_ == iVar11);
                  auVar31._12_4_ = -(uint)(auVar28._12_4_ == iVar27);
                  auVar31._0_4_ = auVar31._4_4_;
                  auVar31._8_4_ = auVar31._12_4_;
                  auVar54 = pshuflw(in_XMM7,auVar31,0xe8);
                  auVar29._0_4_ = auVar29._4_4_;
                  auVar29._8_4_ = auVar29._12_4_;
                  auVar28 = pshuflw(auVar24,auVar29,0xe8);
                  auVar28 = (auVar28 | auVar54 & auVar24) ^ _DAT_00119100;
                  auVar28 = packssdw(auVar28,auVar28);
                  if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    pbVar10[-0x3fc] = true;
                  }
                  auVar29 = auVar31 & auVar42 | auVar29;
                  auVar28 = packssdw(auVar29,auVar29);
                  auVar28 = packssdw(auVar28 ^ _DAT_00119100,auVar28 ^ _DAT_00119100);
                  auVar28 = packsswb(auVar28,auVar28);
                  if ((auVar28._0_4_ >> 8 & 1) != 0) {
                    pbVar10[-0x3b8] = true;
                  }
                  auVar28 = (auVar40 | _DAT_00119030) ^ _DAT_00119050;
                  iVar49 = -(uint)(iVar7 < auVar28._0_4_);
                  auVar50._4_4_ = -(uint)(iVar11 < auVar28._4_4_);
                  iVar53 = -(uint)(iVar26 < auVar28._8_4_);
                  auVar50._12_4_ = -(uint)(iVar27 < auVar28._12_4_);
                  auVar30._4_4_ = iVar49;
                  auVar30._0_4_ = iVar49;
                  auVar30._8_4_ = iVar53;
                  auVar30._12_4_ = iVar53;
                  auVar41._4_4_ = -(uint)(auVar28._4_4_ == iVar11);
                  auVar41._12_4_ = -(uint)(auVar28._12_4_ == iVar27);
                  auVar41._0_4_ = auVar41._4_4_;
                  auVar41._8_4_ = auVar41._12_4_;
                  auVar50._0_4_ = auVar50._4_4_;
                  auVar50._8_4_ = auVar50._12_4_;
                  auVar28 = auVar41 & auVar30 | auVar50;
                  auVar28 = packssdw(auVar28,auVar28);
                  auVar28 = packssdw(auVar28 ^ _DAT_00119100,auVar28 ^ _DAT_00119100);
                  auVar28 = packsswb(auVar28,auVar28);
                  if ((auVar28._0_4_ >> 0x10 & 1) != 0) {
                    pbVar10[-0x374] = true;
                  }
                  auVar31 = pshufhw(auVar30,auVar30,0x84);
                  auVar42 = pshufhw(auVar41,auVar41,0x84);
                  auVar29 = pshufhw(auVar31,auVar50,0x84);
                  auVar31 = (auVar29 | auVar42 & auVar31) ^ _DAT_00119100;
                  auVar31 = packssdw(auVar31,auVar31);
                  auVar31 = packsswb(auVar31,auVar31);
                  if ((auVar31._0_4_ >> 0x18 & 1) != 0) {
                    pbVar10[-0x330] = true;
                  }
                  auVar31 = (auVar40 | _DAT_001190f0) ^ _DAT_00119050;
                  iVar49 = -(uint)(iVar7 < auVar31._0_4_);
                  auVar33._4_4_ = -(uint)(iVar11 < auVar31._4_4_);
                  iVar53 = -(uint)(iVar26 < auVar31._8_4_);
                  auVar33._12_4_ = -(uint)(iVar27 < auVar31._12_4_);
                  auVar43._4_4_ = iVar49;
                  auVar43._0_4_ = iVar49;
                  auVar43._8_4_ = iVar53;
                  auVar43._12_4_ = iVar53;
                  auVar28 = pshuflw(auVar28,auVar43,0xe8);
                  auVar32._4_4_ = -(uint)(auVar31._4_4_ == iVar11);
                  auVar32._12_4_ = -(uint)(auVar31._12_4_ == iVar27);
                  auVar32._0_4_ = auVar32._4_4_;
                  auVar32._8_4_ = auVar32._12_4_;
                  auVar31 = pshuflw(auVar54 & auVar24,auVar32,0xe8);
                  auVar33._0_4_ = auVar33._4_4_;
                  auVar33._8_4_ = auVar33._12_4_;
                  auVar24 = pshuflw(auVar28,auVar33,0xe8);
                  auVar24 = (auVar24 | auVar31 & auVar28) ^ _DAT_00119100;
                  auVar24 = packssdw(auVar24,auVar24);
                  auVar24 = packsswb(auVar24,auVar24);
                  if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    pbVar10[-0x2ec] = true;
                  }
                  auVar33 = auVar32 & auVar43 | auVar33;
                  auVar24 = packssdw(auVar33,auVar33);
                  auVar24 = packssdw(auVar24 ^ _DAT_00119100,auVar24 ^ _DAT_00119100);
                  auVar24 = packsswb(auVar24,auVar24);
                  if ((auVar24._4_2_ >> 8 & 1) != 0) {
                    pbVar10[-0x2a8] = true;
                  }
                  auVar24 = (auVar40 | _DAT_001190e0) ^ _DAT_00119050;
                  iVar49 = -(uint)(iVar7 < auVar24._0_4_);
                  auVar51._4_4_ = -(uint)(iVar11 < auVar24._4_4_);
                  iVar53 = -(uint)(iVar26 < auVar24._8_4_);
                  auVar51._12_4_ = -(uint)(iVar27 < auVar24._12_4_);
                  auVar54._4_4_ = iVar49;
                  auVar54._0_4_ = iVar49;
                  auVar54._8_4_ = iVar53;
                  auVar54._12_4_ = iVar53;
                  auVar44._4_4_ = -(uint)(auVar24._4_4_ == iVar11);
                  auVar44._12_4_ = -(uint)(auVar24._12_4_ == iVar27);
                  auVar44._0_4_ = auVar44._4_4_;
                  auVar44._8_4_ = auVar44._12_4_;
                  auVar51._0_4_ = auVar51._4_4_;
                  auVar51._8_4_ = auVar51._12_4_;
                  auVar24 = auVar44 & auVar54 | auVar51;
                  auVar24 = packssdw(auVar24,auVar24);
                  auVar24 = packssdw(auVar24 ^ _DAT_00119100,auVar24 ^ _DAT_00119100);
                  auVar24 = packsswb(auVar24,auVar24);
                  if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    pbVar10[-0x264] = true;
                  }
                  auVar29 = pshufhw(auVar54,auVar54,0x84);
                  auVar54 = pshufhw(auVar44,auVar44,0x84);
                  auVar42 = pshufhw(auVar29,auVar51,0x84);
                  auVar29 = (auVar42 | auVar54 & auVar29) ^ _DAT_00119100;
                  auVar29 = packssdw(auVar29,auVar29);
                  auVar29 = packsswb(auVar29,auVar29);
                  if ((auVar29._6_2_ >> 8 & 1) != 0) {
                    pbVar10[-0x220] = true;
                  }
                  auVar29 = (auVar40 | _DAT_001190d0) ^ _DAT_00119050;
                  iVar49 = -(uint)(iVar7 < auVar29._0_4_);
                  auVar35._4_4_ = -(uint)(iVar11 < auVar29._4_4_);
                  iVar53 = -(uint)(iVar26 < auVar29._8_4_);
                  auVar35._12_4_ = -(uint)(iVar27 < auVar29._12_4_);
                  auVar45._4_4_ = iVar49;
                  auVar45._0_4_ = iVar49;
                  auVar45._8_4_ = iVar53;
                  auVar45._12_4_ = iVar53;
                  auVar24 = pshuflw(auVar24,auVar45,0xe8);
                  auVar34._4_4_ = -(uint)(auVar29._4_4_ == iVar11);
                  auVar34._12_4_ = -(uint)(auVar29._12_4_ == iVar27);
                  auVar34._0_4_ = auVar34._4_4_;
                  auVar34._8_4_ = auVar34._12_4_;
                  auVar31 = pshuflw(auVar31 & auVar28,auVar34,0xe8);
                  auVar35._0_4_ = auVar35._4_4_;
                  auVar35._8_4_ = auVar35._12_4_;
                  auVar28 = pshuflw(auVar24,auVar35,0xe8);
                  auVar28 = (auVar28 | auVar31 & auVar24) ^ _DAT_00119100;
                  auVar28 = packssdw(auVar28,auVar28);
                  auVar28 = packsswb(auVar28,auVar28);
                  if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    pbVar10[-0x1dc] = true;
                  }
                  auVar35 = auVar34 & auVar45 | auVar35;
                  auVar28 = packssdw(auVar35,auVar35);
                  auVar28 = packssdw(auVar28 ^ _DAT_00119100,auVar28 ^ _DAT_00119100);
                  auVar28 = packsswb(auVar28,auVar28);
                  if ((auVar28._8_2_ >> 8 & 1) != 0) {
                    pbVar10[-0x198] = true;
                  }
                  auVar28 = (auVar40 | _DAT_001190c0) ^ _DAT_00119050;
                  iVar49 = -(uint)(iVar7 < auVar28._0_4_);
                  auVar52._4_4_ = -(uint)(iVar11 < auVar28._4_4_);
                  iVar53 = -(uint)(iVar26 < auVar28._8_4_);
                  auVar52._12_4_ = -(uint)(iVar27 < auVar28._12_4_);
                  auVar36._4_4_ = iVar49;
                  auVar36._0_4_ = iVar49;
                  auVar36._8_4_ = iVar53;
                  auVar36._12_4_ = iVar53;
                  auVar46._4_4_ = -(uint)(auVar28._4_4_ == iVar11);
                  auVar46._12_4_ = -(uint)(auVar28._12_4_ == iVar27);
                  auVar46._0_4_ = auVar46._4_4_;
                  auVar46._8_4_ = auVar46._12_4_;
                  auVar52._0_4_ = auVar52._4_4_;
                  auVar52._8_4_ = auVar52._12_4_;
                  auVar28 = auVar46 & auVar36 | auVar52;
                  auVar28 = packssdw(auVar28,auVar28);
                  auVar28 = packssdw(auVar28 ^ _DAT_00119100,auVar28 ^ _DAT_00119100);
                  auVar28 = packsswb(auVar28,auVar28);
                  if ((auVar28 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    pbVar10[-0x154] = true;
                  }
                  auVar29 = pshufhw(auVar36,auVar36,0x84);
                  auVar54 = pshufhw(auVar46,auVar46,0x84);
                  auVar42 = pshufhw(auVar29,auVar52,0x84);
                  auVar29 = (auVar42 | auVar54 & auVar29) ^ _DAT_00119100;
                  auVar29 = packssdw(auVar29,auVar29);
                  auVar29 = packsswb(auVar29,auVar29);
                  if ((auVar29._10_2_ >> 8 & 1) != 0) {
                    pbVar10[-0x110] = true;
                  }
                  auVar29 = (auVar40 | _DAT_001190b0) ^ _DAT_00119050;
                  iVar49 = -(uint)(iVar7 < auVar29._0_4_);
                  auVar38._4_4_ = -(uint)(iVar11 < auVar29._4_4_);
                  iVar53 = -(uint)(iVar26 < auVar29._8_4_);
                  auVar38._12_4_ = -(uint)(iVar27 < auVar29._12_4_);
                  auVar47._4_4_ = iVar49;
                  auVar47._0_4_ = iVar49;
                  auVar47._8_4_ = iVar53;
                  auVar47._12_4_ = iVar53;
                  auVar28 = pshuflw(auVar28,auVar47,0xe8);
                  auVar37._4_4_ = -(uint)(auVar29._4_4_ == iVar11);
                  auVar37._12_4_ = -(uint)(auVar29._12_4_ == iVar27);
                  auVar37._0_4_ = auVar37._4_4_;
                  auVar37._8_4_ = auVar37._12_4_;
                  in_XMM7 = pshuflw(auVar31 & auVar24,auVar37,0xe8);
                  in_XMM7 = in_XMM7 & auVar28;
                  auVar38._0_4_ = auVar38._4_4_;
                  auVar38._8_4_ = auVar38._12_4_;
                  auVar24 = pshuflw(auVar28,auVar38,0xe8);
                  auVar24 = (auVar24 | in_XMM7) ^ _DAT_00119100;
                  auVar24 = packssdw(auVar24,auVar24);
                  in_XMM6 = packsswb(auVar24,auVar24);
                  if ((in_XMM6 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    pbVar10[-0xcc] = true;
                  }
                  auVar38 = auVar37 & auVar47 | auVar38;
                  auVar24 = packssdw(auVar38,auVar38);
                  auVar24 = packssdw(auVar24 ^ _DAT_00119100,auVar24 ^ _DAT_00119100);
                  auVar24 = packsswb(auVar24,auVar24);
                  if ((auVar24._12_2_ >> 8 & 1) != 0) {
                    pbVar10[-0x88] = true;
                  }
                  auVar24 = (auVar40 | _DAT_001190a0) ^ _DAT_00119050;
                  auVar48._0_4_ = -(uint)(iVar7 < auVar24._0_4_);
                  auVar48._4_4_ = -(uint)(iVar11 < auVar24._4_4_);
                  auVar48._8_4_ = -(uint)(iVar26 < auVar24._8_4_);
                  auVar48._12_4_ = -(uint)(iVar27 < auVar24._12_4_);
                  auVar39._4_4_ = auVar48._0_4_;
                  auVar39._0_4_ = auVar48._0_4_;
                  auVar39._8_4_ = auVar48._8_4_;
                  auVar39._12_4_ = auVar48._8_4_;
                  auVar23._4_4_ = -(uint)(auVar24._4_4_ == iVar11);
                  auVar23._12_4_ = -(uint)(auVar24._12_4_ == iVar27);
                  auVar23._0_4_ = auVar23._4_4_;
                  auVar23._8_4_ = auVar23._12_4_;
                  auVar25._4_4_ = auVar48._4_4_;
                  auVar25._0_4_ = auVar48._4_4_;
                  auVar25._8_4_ = auVar48._12_4_;
                  auVar25._12_4_ = auVar48._12_4_;
                  auVar24 = packssdw(auVar48,auVar23 & auVar39 | auVar25);
                  auVar24 = packssdw(auVar24 ^ _DAT_00119100,auVar24 ^ _DAT_00119100);
                  auVar24 = packsswb(auVar24,auVar24);
                  if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    pbVar10[-0x44] = true;
                  }
                  auVar40 = pshufhw(auVar39,auVar39,0x84);
                  auVar24 = pshufhw(auVar23,auVar23,0x84);
                  auVar28 = pshufhw(auVar25,auVar25,0x84);
                  auVar24 = packssdw(auVar24 & auVar40,(auVar28 | auVar24 & auVar40) ^ _DAT_00119100
                                    );
                  auVar24 = packsswb(auVar24,auVar24);
                  if ((auVar24._14_2_ >> 8 & 1) != 0) {
                    *pbVar10 = true;
                  }
                  uVar13 = uVar13 + 0x10;
                  pbVar10 = pbVar10 + 0x440;
                } while ((uVar17 / 0x44 + 0x10 & 0xfffffffffffffff0) != uVar13);
              }
              (this->state).n_rounds_powerpill = Arguments::n_rounds_powerpill;
            }
            else {
              if (cVar1 != '.') {
                sprintf((char *)local_f8,"Invalid cell_content character \'%c\'",
                        (ulong)(uint)(int)cVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error[",6)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                           ,0x5a);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][",2);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"play",4);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"][Line ",7);
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xf1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
                sVar6 = strlen((char *)local_f8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_f8,sVar6);
                std::endl<char,std::char_traits<char>>(poVar4);
                goto LAB_0010c119;
              }
              *(undefined1 *)
               (*(long *)&(this->state).maze.t.
                          super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar15].
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data + lVar18) = 0x20;
              piVar14 = &(this->state).n_normal_pills_left;
              *piVar14 = *piVar14 + -1;
              local_f8[0] = PathMagic::index_from_pos.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar15].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar18];
              std::
              _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_erase(local_138,local_f8);
              (*this->pacman->_vptr_Agent[2])();
            }
          }
LAB_0010bdc8:
          if ((pointer)local_158._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_158._0_8_);
          }
          if (bVar2) goto LAB_0010b38b;
        }
        else {
          (*this->pacman->_vptr_Agent[5])();
          (this->state).pacman.step = (1.0 - (this->state).pacman.step) * Arguments::pacman_speed;
          (this->state).pacman.dir.i = iVar3;
          (this->state).pacman.dir.j = extraout_var;
LAB_0010b38b:
          iVar3 = (this->state).round / Arguments::n_rounds_between_ghosts_start + 1;
          ppAVar9 = (this->ghosts).super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar7 = (int)((ulong)((long)(this->ghosts).
                                      super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)ppAVar9) >> 3);
          if (iVar7 <= iVar3) {
            iVar3 = iVar7;
          }
          if (0 < iVar3) {
            lVar12 = 0;
            uVar17 = 0;
            do {
              pGVar5 = (this->state).ghosts.
                       super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar3 = *(int *)((long)&pGVar5->n_rounds_revive + lVar12);
              if (iVar3 == 1) {
                *(undefined8 *)((long)&(pGVar5->super_Agent_State).pos.i + lVar12) =
                     *(undefined8 *)((long)&(pGVar5->initial_pos).i + lVar12);
                *(undefined4 *)((long)&pGVar5->n_rounds_revive + lVar12) = 0;
              }
              else if (iVar3 == 0) {
                iVar3 = (**ppAVar9[uVar17]->_vptr_Agent)(ppAVar9[uVar17],s,uVar17 & 0xffffffff);
                if ((*(int *)((long)&(pGVar5->super_Agent_State).dir.i + lVar12) == iVar3) &&
                   (*(int *)((long)&(pGVar5->super_Agent_State).dir.j + lVar12) == extraout_var_00))
                {
                  fVar19 = Arguments::ghost_speed;
                  if (((&((this->state).ghosts.
                          super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                          super__Vector_impl_data._M_start)->maybe_scared)[lVar12] & 1U) != 0) {
                    fVar19 = Arguments::ghost_afraid_speed_fraction * Arguments::ghost_speed;
                  }
                  iVar7 = (this->state).n_rounds_powerpill;
                  if (iVar7 < 1) {
                    fVar19 = Arguments::ghost_speed;
                  }
                  fVar19 = fVar19 + *(float *)((long)&(pGVar5->super_Agent_State).step + lVar12);
                  *(float *)((long)&(pGVar5->super_Agent_State).step + lVar12) = fVar19;
                  if (1.0 <= fVar19) {
                    *(float *)((long)&(pGVar5->super_Agent_State).step + lVar12) = fVar19 + -1.0;
                    iVar3 = iVar3 + *(int *)((long)&(pGVar5->super_Agent_State).pos.i + lVar12);
                    iVar11 = extraout_var_00 +
                             *(int *)((long)&(pGVar5->super_Agent_State).pos.j + lVar12);
                    if (*(char *)(*(long *)&(this->state).maze.t.
                                            super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[iVar3].
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            super__Vector_impl_data + (long)iVar11) == '%') {
                      sprintf((char *)local_f8,"Ghost #%d at [%d,%d] crashes with wall",
                              uVar17 & 0xffffffff);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Debug[",6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                                 ,0x5a);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"][",2);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"play",4);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"][Line ",7);
                      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x10c);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
                      sVar6 = strlen((char *)local_f8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar4,(char *)local_f8,sVar6);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4)
                      ;
                      std::ostream::put((char)poVar4);
                      std::ostream::flush();
                    }
                    else {
                      *(int *)((long)&(pGVar5->super_Agent_State).pos.i + lVar12) = iVar3;
                      *(int *)((long)&(pGVar5->super_Agent_State).pos.j + lVar12) = iVar11;
                      if (((this->state).pacman.pos.i == iVar3) &&
                         ((this->state).pacman.pos.j == iVar11)) {
                        if ((iVar7 < 1) || (((&pGVar5->maybe_scared)[lVar12] & 1U) == 0)) {
                          this->game_over = true;
                        }
                        else {
                          (*this->pacman->_vptr_Agent[4])();
                          (&pGVar5->maybe_scared)[lVar12] = false;
                          *(int *)((long)&pGVar5->n_rounds_revive + lVar12) =
                               Arguments::n_rounds_ghost_revive;
                          *(undefined8 *)((long)&(pGVar5->super_Agent_State).pos.i + lVar12) =
                               0xffffffffffffffff;
                          if ((this->game_over & 1U) == 0) goto LAB_0010b64c;
                        }
                        iVar3 = 9;
                        goto LAB_0010bdf3;
                      }
                    }
                  }
                }
                else {
                  fVar19 = Arguments::ghost_speed;
                  if (((&((this->state).ghosts.
                          super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                          super__Vector_impl_data._M_start)->maybe_scared)[lVar12] & 1U) != 0) {
                    fVar19 = Arguments::ghost_afraid_speed_fraction * Arguments::ghost_speed;
                  }
                  if ((this->state).n_rounds_powerpill < 1) {
                    fVar19 = Arguments::ghost_speed;
                  }
                  *(float *)((long)&(pGVar5->super_Agent_State).step + lVar12) =
                       (1.0 - *(float *)((long)&(pGVar5->super_Agent_State).step + lVar12)) * fVar19
                  ;
                  *(int *)((long)&(pGVar5->super_Agent_State).dir.i + lVar12) = iVar3;
                  *(int *)((long)&(pGVar5->super_Agent_State).dir.j + lVar12) = extraout_var_00;
                }
              }
              else {
                *(int *)((long)&pGVar5->n_rounds_revive + lVar12) = iVar3 + -1;
              }
LAB_0010b64c:
              *(Position *)
               ((long)&(((this->state).ghosts.
                         super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
                         super__Vector_impl_data._M_start)->super_Agent_State).prev.i + lVar12) =
                   local_110.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar17];
              uVar17 = uVar17 + 1;
              iVar3 = (this->state).round / Arguments::n_rounds_between_ghosts_start + 1;
              ppAVar9 = (this->ghosts).super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl
                        .super__Vector_impl_data._M_start;
              iVar7 = (int)((ulong)((long)(this->ghosts).
                                          super__Vector_base<Agent_*,_std::allocator<Agent_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar9)
                           >> 3);
              if (iVar7 <= iVar3) {
                iVar3 = iVar7;
              }
              lVar12 = lVar12 + 0x44;
            } while ((long)uVar17 < (long)iVar3);
          }
          (this->state).pacman.prev.i = local_118.i;
          (this->state).pacman.prev.j = local_118.j;
          iVar3 = 0;
          if (Arguments::plays == 1) {
            poVar4 = operator<<((ostream *)&std::cout,s);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            iVar3 = 0;
          }
        }
LAB_0010bdf3:
        if (local_110.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_110.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      } while (iVar3 == 0);
      if (Arguments::plays == 1) {
        poVar4 = operator<<((ostream *)&std::cout,s);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        pcVar16 = "WON";
        if ((ulong)this->game_over != 0) {
          pcVar16 = "LOST";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,pcVar16,(ulong)this->game_over + 3);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
      }
      bVar2 = this->game_over;
      (this->result).won = (bool)(bVar2 ^ 1);
      (this->result).completion =
           1.0 - (double)((this->state).n_powerpills_left + (this->state).n_normal_pills_left) /
                 (double)State::total_pills;
      (*this->pacman->_vptr_Agent[1])(this->pacman,(ulong)(bVar2 == false));
      return &this->result;
    }
    uStack_e8 = 0x6f;
    uStack_e7 = 0x61207475;
    uStack_e3 = 0x206e;
    uStack_e1 = 0x61;
    uStack_e0 = 0x67;
    uStack_df = 0x746e65;
    local_f8 = (int  [2])0x70206f7420797254;
    uStack_f0 = 0x6c;
    uStack_ef = 0x77207961;
    uStack_eb = 0x7469;
    uStack_e9 = 0x68;
    poVar4 = std::operator<<((ostream *)&std::cout,"Error[");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/game.hh"
                            );
    poVar4 = std::operator<<(poVar4,"][");
    poVar4 = std::operator<<(poVar4,"play");
    poVar4 = std::operator<<(poVar4,"][Line ");
    iVar3 = 0xac;
  }
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,"] ");
  poVar4 = std::operator<<(poVar4,(char *)local_f8);
  std::endl<char,std::char_traits<char>>(poVar4);
LAB_0010c119:
  exit(1);
}

Assistant:

GameResult& play() {
        ensure(loaded_maze, "Try to play without a loaded maze");
        ensure(pacman != NULL, "Try to play without an agent");

        if (Arguments::plays == 1) cout << state << endl;

        while (state.n_powerpills_left + state.n_normal_pills_left > 0) { // break if game_over
            if (Arguments::plays == 1) {
                cout.flush();
                usleep(Arguments::visualization_speed);
            }

            update_ghost_states();

            ++state.round;

            state.n_rounds_powerpill = max(0, state.n_rounds_powerpill - 1);

            Direction pacman_direction = pacman->take_action(state, 0);

            Position pacman_previous_pos = state.pacman.pos;
            vector<Position> ghost_previous_pos(state.n_ghosts);
            for (int i = 0; i < state.n_ghosts; ++i) ghost_previous_pos[i] = state.ghosts[i].pos;

            // TODO: Maybe process movements stochastically to guarantee equality?

            if (state.pacman.dir == pacman_direction) {
                state.pacman.step += Arguments::pacman_speed;

                if (state.pacman.step >= 1) {
                    --state.pacman.step;

                    Position next_pos = state.pacman.pos.move_destination(pacman_direction);
                    char cell_content = state.maze[next_pos.i][next_pos.j];


                    if (cell_content == State::WALL) {
                        _debug("Pacman crashes with wall");
                    }
                    else if (cell_content == State::SPAWN_AREA) {
                        _debug("Pacman crashes with spawn area");
                        assert(false);
                    }
                    else {
                        state.pacman.pos.move(pacman_direction);

                        vector<int> ghosts_pos = state.ghosts_in_position(next_pos);

                        for (int ghost_id : ghosts_pos)
                            if (game_over_on_collision(state.ghosts[ghost_id]))
                                goto end;

                        switch(cell_content) {
                            case State::PILL:
                                state.maze[next_pos.i][next_pos.j] = State::FREE;
                                --state.n_normal_pills_left;
                                state.pills.erase(PathMagic::id(next_pos));
                                pacman->notify_eaten_pill();
                                break;
                            case State::POWER_PILL:
                                state.maze[next_pos.i][next_pos.j] = State::FREE;
                                --state.n_powerpills_left;
                                state.pills.erase(PathMagic::id(next_pos));
                                state.powerpills.erase(PathMagic::id(next_pos));
                                pacman->notify_eaten_powerpill();

                                for (Ghost_State& ghost : state.ghosts) ghost.maybe_scared = true;

                                state.n_rounds_powerpill = Arguments::n_rounds_powerpill;
                                break;
                            case State::FREE: break;
                            default: ensure(false, "Invalid cell_content character '%c'", cell_content);
                        }
                    }
                }
            }
            else {
                pacman->notify_reverse_direction();
                state.pacman.step = (1 - state.pacman.step)*Arguments::pacman_speed;
                state.pacman.dir = pacman_direction;
            }

            for (int i = 0; i < min(1 + state.round/Arguments::n_rounds_between_ghosts_start, (int) ghosts.size()); ++i) {
                Ghost_State& ghost = state.ghosts[i];

                if (ghost.is_alive()) {
                    Direction ghost_direction = ghosts[i]->take_action(state, i);

                    if (ghost_direction == ghost.dir) {
                        ghost.step += ghost_speed(i);

                        if (ghost.step >= 1) {
                            --ghost.step;

                            Position next_pos = ghost.pos.move_destination(ghost_direction);
                            char cell_content = state.maze[next_pos.i][next_pos.j];

                            if (cell_content == State::WALL) {
                                _debug("Ghost #%d at [%d,%d] crashes with wall", i, ghost.pos.i, ghost.pos.j);
                            }
                            else {
                                ghost.pos.move(ghost_direction);

                                if (state.pacman.pos == next_pos and game_over_on_collision(ghost))
                                    goto end;
                            }
                        }
                    }
                    else {
                        ghost.step = (1 - ghost.step)*ghost_speed(i);
                        ghost.dir = ghost_direction;
                    }
                }
                else if (ghost.n_rounds_revive == 1) {
                    ghost.pos = ghost.initial_pos;
                    ghost.n_rounds_revive = 0;
                }
                else {
                    --ghost.n_rounds_revive;
                }

                state.ghosts[i].prev = ghost_previous_pos[i];
            }

            state.pacman.prev = pacman_previous_pos;

            if (Arguments::plays == 1) cout << state << endl;
        }

        end:

        if (Arguments::plays == 1) {
            cout << state << endl;
            cout << (game_over ? "LOST" : "WON") << endl;
        }

        this->result.won = not game_over;
        this->result.completion = 1 - (state.n_normal_pills_left + state.n_powerpills_left)/double(state.total_pills);
        pacman->notify_game_result(this->result.won);
        return this->result;
    }